

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhash.c
# Opt level: O2

int rhash_file(uint hash_id,char *filepath,uchar *result)

{
  int iVar1;
  FILE *__stream;
  rhash ctx;
  int *piVar2;
  
  if ((hash_id & 0x3ff) == 0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
  }
  else {
    __stream = fopen64(filepath,"rb");
    if (__stream != (FILE *)0x0) {
      ctx = rhash_init(hash_id & 0x3ff);
      if (ctx != (rhash)0x0) {
        iVar1 = rhash_file_update(ctx,(FILE *)__stream);
        fclose(__stream);
        rhash_final(ctx,result);
        rhash_free(ctx);
        return iVar1;
      }
      fclose(__stream);
    }
  }
  return -1;
}

Assistant:

RHASH_API int rhash_file(unsigned hash_id, const char* filepath, unsigned char* result)
{
	FILE* fd;
	rhash ctx;
	int res;

	hash_id &= RHASH_ALL_HASHES;
	if (hash_id == 0) {
		errno = EINVAL;
		return -1;
	}

	if ((fd = fopen(filepath, "rb")) == NULL) return -1;

	if ((ctx = rhash_init(hash_id)) == NULL) {
		fclose(fd);
		return -1;
	}

	res = rhash_file_update(ctx, fd); /* hash the file */
	fclose(fd);

	rhash_final(ctx, result);
	rhash_free(ctx);
	return res;
}